

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O1

void fiobj_data_pre_write(FIOBJ o,uintptr_t length)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined1 *__dest;
  ssize_t sVar4;
  void *pvVar5;
  void *pvVar6;
  int *piVar7;
  size_t __n;
  long unaff_RBP;
  fio_str_info_s *ptr;
  size_t unaff_R12;
  void *unaff_R13;
  ulong uVar8;
  fio_str_info_s *unaff_R15;
  fio_str_info_s *pfVar9;
  char name_template [31];
  stat sStack_118;
  FIOBJ FStack_88;
  size_t sStack_80;
  void *pvStack_78;
  void *pvStack_70;
  undefined1 *puStack_68;
  code *pcStack_60;
  fio_str_info_s fStack_58;
  undefined7 uStack_40;
  
  ptr = &fStack_58;
  pfVar9 = &fStack_58;
  pvVar5 = (void *)length;
  if (*(int *)(o + 0x30) == -2) {
    if (*(int *)(*(long *)(o + 0x10) + 0x30) == -1) {
      pcStack_60 = (code *)0x14102c;
      pvVar5 = fio_malloc(*(long *)(o + 0x20) + 1);
      *(void **)(o + 8) = pvVar5;
      pcStack_60 = (code *)0x141048;
      memcpy(pvVar5,(void *)(*(long *)(*(long *)(o + 0x10) + 8) + *(long *)(o + 0x18)),
             *(size_t *)(o + 0x20));
      *(undefined1 *)(*(long *)(o + 8) + *(long *)(o + 0x20)) = 0;
      *(undefined8 *)(o + 0x18) = *(undefined8 *)(o + 0x20);
      *(undefined4 *)(o + 0x30) = 0xffffffff;
      pcStack_60 = (code *)0x14106c;
      fiobj_free(*(FIOBJ *)(o + 0x10));
      *(code **)(o + 0x10) = fio_free;
    }
    else {
      fStack_58.data._0_7_ = 0x585f656c696670;
      fStack_58.data._7_1_ = 0x58;
      uStack_40 = 0x585858585858;
      fStack_58.capa._0_1_ = '/';
      fStack_58.capa._1_1_ = 't';
      fStack_58.capa._2_1_ = 'm';
      fStack_58.capa._3_1_ = 'p';
      fStack_58.capa._4_1_ = '/';
      fStack_58.capa._5_1_ = 'f';
      fStack_58.capa._6_1_ = 'a';
      fStack_58.capa._7_1_ = 'c';
      fStack_58.len._0_7_ = 0x745f6f695f6c69;
      fStack_58.len._7_1_ = 0x6d;
      pcStack_60 = (code *)0x140f86;
      iVar2 = mkstemp((char *)&fStack_58);
      *(int *)(o + 0x30) = iVar2;
      if (iVar2 < 0) goto LAB_001410c9;
      unaff_RBP = 0;
      do {
        pcStack_60 = (code *)0x140fae;
        fiobj_data_pread(&fStack_58,*(FIOBJ *)(o + 0x10),*(long *)(o + 0x18) + unaff_RBP,0x1000);
        unaff_R13 = (void *)CONCAT17(fStack_58.data._7_1_,fStack_58.data._0_7_);
        unaff_R12 = *(ulong *)(o + 0x20) - unaff_RBP;
        if (CONCAT17(fStack_58.len._7_1_,(undefined7)fStack_58.len) + unaff_RBP <=
            *(ulong *)(o + 0x20)) {
          unaff_R12 = CONCAT17(fStack_58.len._7_1_,(undefined7)fStack_58.len);
        }
        while( true ) {
          pcStack_60 = (code *)0x140fdb;
          pvVar5 = unaff_R13;
          sVar4 = write(*(int *)(o + 0x30),unaff_R13,unaff_R12);
          if (-1 < sVar4) break;
          pcStack_60 = (code *)0x140fe5;
          ptr = (fio_str_info_s *)__errno_location();
          if (*(int *)ptr != 4) {
            pcStack_60 = (code *)0x1410bf;
            fiobj_data_pre_write_cold_1();
            goto LAB_001410bf;
          }
        }
        unaff_RBP = unaff_RBP + sVar4;
      } while (unaff_R12 == 0x1000);
      pcStack_60 = (code *)0x141004;
      fiobj_free(*(FIOBJ *)(o + 0x10));
      *(undefined8 *)(o + 0x18) = 0;
      *(long *)(o + 0x20) = unaff_RBP;
      *(undefined8 *)(o + 0x10) = *(undefined8 *)(o + 0x28);
      *(undefined8 *)(o + 0x28) = 0;
      *(undefined8 *)(o + 8) = 0;
      unaff_R15 = &fStack_58;
    }
LAB_00141077:
    uVar8 = length + *(long *)(o + 0x20);
    if (uVar8 <= *(ulong *)(o + 0x18)) {
      return;
    }
    length = (uVar8 & 0xfffffffffffff000) + 0x1000;
    *(uintptr_t *)(o + 0x18) = length;
    ptr = *(fio_str_info_s **)(o + 8);
    pcStack_60 = (code *)0x14109f;
    pvVar5 = (void *)length;
    pvVar6 = fio_realloc(ptr,length);
    *(void **)(o + 8) = pvVar6;
    pfVar9 = unaff_R15;
    if (pvVar6 != (void *)0x0) {
      return;
    }
LAB_001410bf:
    pcStack_60 = (code *)0x1410c4;
    fiobj_data_pre_write_cold_4();
  }
  else {
    if ((*(int *)(o + 0x30) != -1) || (*(code **)(o + 0x10) == fio_free)) goto LAB_00141077;
    ptr = (fio_str_info_s *)((*(ulong *)(o + 0x20) & 0xfffffffffffff000) + 0x1000);
    *(fio_str_info_s **)(o + 0x18) = ptr;
    pcStack_60 = (code *)0x140f1c;
    __dest = (undefined1 *)fio_malloc((size_t)ptr);
    pfVar9 = unaff_R15;
    if (__dest != (undefined1 *)0x0) {
      pcStack_60 = (code *)0x140f38;
      memcpy(__dest,*(void **)(o + 8),*(size_t *)(o + 0x20));
      if (*(code **)(o + 0x10) != (code *)0x0) {
        pcStack_60 = (code *)0x140f47;
        (**(code **)(o + 0x10))(*(undefined8 *)(o + 8));
      }
      *(code **)(o + 0x10) = fio_free;
      *(undefined1 **)(o + 8) = __dest;
      unaff_R15 = (fio_str_info_s *)__dest;
      goto LAB_00141077;
    }
  }
  pcStack_60 = (code *)0x1410c9;
  fiobj_data_pre_write_cold_3();
  unaff_R15 = pfVar9;
LAB_001410c9:
  pcStack_60 = fiobj_data_write;
  fiobj_data_pre_write_cold_2();
  FStack_88 = o;
  sStack_80 = unaff_R12;
  pvStack_78 = unaff_R13;
  pvStack_70 = (void *)length;
  puStack_68 = (undefined1 *)unaff_R15;
  pcStack_60 = (code *)unaff_RBP;
  if ((((ptr == (fio_str_info_s *)0x0) || ((~(uint)ptr & 6) == 0 || ((ulong)ptr & 1) != 0)) ||
      (*(char *)((ulong)ptr & 0xfffffffffffffff8) != '+')) || (__n != 0 && pvVar5 == (void *)0x0)) {
    piVar7 = __errno_location();
    *piVar7 = 0xe;
  }
  else {
    piVar7 = __errno_location();
    *piVar7 = 0;
    if (*(int *)((long)ptr + 0x30) == -2) {
      fiobj_data_assert_dynamic((FIOBJ)ptr);
    }
    iVar2 = *(int *)((long)ptr + 0x30);
    if (iVar2 != -1) {
      do {
        iVar3 = fstat(*(int *)((long)ptr + 0x30),&sStack_118);
        if (iVar3 == 0) goto LAB_001411c8;
      } while (*piVar7 == 4);
      sStack_118.st_size = -1;
LAB_001411c8:
      pwrite(iVar2,pvVar5,__n,sStack_118.st_size);
      return;
    }
    fiobj_data_pre_write((FIOBJ)ptr,__n + 1);
    memcpy((void *)(*(long *)((long)ptr + 8) + *(long *)((long)ptr + 0x20)),pvVar5,__n);
    lVar1 = *(long *)((long)ptr + 0x20);
    *(size_t *)((long)ptr + 0x20) = lVar1 + __n;
    *(undefined1 *)(*(long *)((long)ptr + 8) + lVar1 + __n) = 0;
  }
  return;
}

Assistant:

static inline void fiobj_data_pre_write(FIOBJ o, uintptr_t length) {
  switch (obj2io(o)->fd) {
  case -1:
    if (obj2io(o)->source.dealloc != fio_free) {
      fiobj_data_copy_buffer(o);
    }
    break;
  case -2:
    fiobj_data_copy_parent(o);
    break;
  }
  if (obj2io(o)->capa >= obj2io(o)->len + length)
    return;
  /* add rounded pages (4096) to capacity */
  obj2io(o)->capa = (((obj2io(o)->len + length) >> 12) + 1) << 12;
  obj2io(o)->buffer = fio_realloc(obj2io(o)->buffer, obj2io(o)->capa);
  REQUIRE_MEM(obj2io(o)->buffer);
}